

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateImportHeaderCode
          (cmExportFileGenerator *this,ostream *os,string *config)

{
  ostream *poVar1;
  cmExportFileGenerator *this_00;
  char *pcVar2;
  
  poVar1 = std::operator<<(os,"#----------------------------------------------------------------\n")
  ;
  std::operator<<(poVar1,"# Generated CMake target import file");
  if (config->_M_string_length == 0) {
    pcVar2 = ".\n";
    poVar1 = os;
  }
  else {
    poVar1 = std::operator<<(os," for configuration \"");
    poVar1 = std::operator<<(poVar1,(string *)config);
    pcVar2 = "\".\n";
  }
  std::operator<<(poVar1,pcVar2);
  this_00 = (cmExportFileGenerator *)
            std::operator<<(os,"#----------------------------------------------------------------\n"
                           );
  std::operator<<((ostream *)this_00,"\n");
  GenerateImportVersionCode(this_00,os);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportHeaderCode(std::ostream& os,
                                                     const std::string& config)
{
  os << "#----------------------------------------------------------------\n"
     << "# Generated CMake target import file";
  if (!config.empty()) {
    os << " for configuration \"" << config << "\".\n";
  } else {
    os << ".\n";
  }
  os << "#----------------------------------------------------------------\n"
     << "\n";
  this->GenerateImportVersionCode(os);
}